

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall
BlockFilterIndex::LookupFilterHashRange
          (BlockFilterIndex *this,int start_height,CBlockIndex *stop_index,
          vector<uint256,_std::allocator<uint256>_> *hashes_out)

{
  long lVar1;
  bool bVar2;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> *in_RCX;
  long in_FS_OFFSET;
  DBVal *entry;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> *__range1;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
  *in_stack_00000048;
  undefined4 in_stack_00000060;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> entries;
  int in_stack_00000124;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
  *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined1 local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>::vector
            (in_stack_ffffffffffffff58);
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator*
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             in_stack_ffffffffffffff68);
  bVar2 = LookupRange((CDBWrapper *)CONCAT44(start_height,in_stack_00000060),(string *)stop_index,
                      in_stack_00000124,(CBlockIndex *)hashes_out,in_stack_00000048);
  if (bVar2) {
    std::vector<uint256,_std::allocator<uint256>_>::clear
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff58);
    std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>::size
              (in_stack_ffffffffffffff58);
    std::vector<uint256,_std::allocator<uint256>_>::reserve
              ((vector<uint256,_std::allocator<uint256>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>::begin
              ((vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>::end
              ((vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
                        ((__normal_iterator<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
                          *)in_RCX,
                         (__normal_iterator<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
      ::operator*((__normal_iterator<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
                   *)in_stack_ffffffffffffff58);
      std::vector<uint256,_std::allocator<uint256>_>::push_back
                ((vector<uint256,_std::allocator<uint256>_> *)in_RCX,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
      ::operator++((__normal_iterator<(anonymous_namespace)::DBVal_*,_std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>_>
                    *)in_stack_ffffffffffffff58);
    }
    local_31 = true;
  }
  else {
    local_31 = false;
    in_RCX = in_stack_ffffffffffffff68;
  }
  std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>::~vector
            (in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::LookupFilterHashRange(int start_height, const CBlockIndex* stop_index,
                                             std::vector<uint256>& hashes_out) const

{
    std::vector<DBVal> entries;
    if (!LookupRange(*m_db, m_name, start_height, stop_index, entries)) {
        return false;
    }

    hashes_out.clear();
    hashes_out.reserve(entries.size());
    for (const auto& entry : entries) {
        hashes_out.push_back(entry.hash);
    }
    return true;
}